

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
::begin(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>
        *this)

{
  ctrl_t cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  uint uVar13;
  ctrl_t *pcVar14;
  anon_union_8_1_a8a14541_for_iterator_2 aVar15;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar16;
  
  AssertNotDebugCapacity(this);
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ <
      2) {
    AssertNotDebugCapacity(this);
    pcVar14 = (ctrl_t *)0x0;
    aVar15 = extraout_RDX;
  }
  else {
    pcVar14 = (this->settings_).
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.control;
    if (pcVar14 == (ctrl_t *)0x0) {
      __assert_fail("ctrl != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x9fb,
                    "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::iterator::iterator(ctrl_t *, MaybeInitializedPtr, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                   );
    }
    aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)
             ((anon_union_8_1_a8a14541_for_iterator_2 *)
             ((long)&(this->settings_).
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_ + 8))->slot_;
    cVar1 = *pcVar14;
    while (cVar1 < kSentinel) {
      iVar5 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar6 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                     CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar14 < (ctrl_t)iVar5);
      in_XMM1_Bb = -(pcVar14[1] < (ctrl_t)((uint)iVar5 >> 8));
      in_XMM1_Bc = -(pcVar14[2] < (ctrl_t)((uint)iVar5 >> 0x10));
      in_XMM1_Bd = -(pcVar14[3] < (ctrl_t)((uint)iVar5 >> 0x18));
      in_XMM1_Be = -(pcVar14[4] < (ctrl_t)iVar6);
      in_XMM1_Bf = -(pcVar14[5] < (ctrl_t)((uint)iVar6 >> 8));
      in_XMM1_Bg = -(pcVar14[6] < (ctrl_t)((uint)iVar6 >> 0x10));
      in_XMM1_Bh = -(pcVar14[7] < (ctrl_t)((uint)iVar6 >> 0x18));
      in_XMM1_Bi = -(pcVar14[8] < (ctrl_t)iVar7);
      in_XMM1_Bj = -(pcVar14[9] < (ctrl_t)((uint)iVar7 >> 8));
      in_XMM1_Bk = -(pcVar14[10] < (ctrl_t)((uint)iVar7 >> 0x10));
      in_XMM1_Bl = -(pcVar14[0xb] < (ctrl_t)((uint)iVar7 >> 0x18));
      in_XMM1_Bm = -(pcVar14[0xc] < (ctrl_t)iVar8);
      in_XMM1_Bn = -(pcVar14[0xd] < (ctrl_t)((uint)iVar8 >> 8));
      in_XMM1_Bo = -(pcVar14[0xe] < (ctrl_t)((uint)iVar8 >> 0x10));
      in_XMM1_Bp = -(pcVar14[0xf] < (ctrl_t)((uint)iVar8 >> 0x18));
      auVar3[1] = in_XMM1_Bb;
      auVar3[0] = in_XMM1_Ba;
      auVar3[2] = in_XMM1_Bc;
      auVar3[3] = in_XMM1_Bd;
      auVar3[4] = in_XMM1_Be;
      auVar3[5] = in_XMM1_Bf;
      auVar3[6] = in_XMM1_Bg;
      auVar3[7] = in_XMM1_Bh;
      auVar3[8] = in_XMM1_Bi;
      auVar3[9] = in_XMM1_Bj;
      auVar3[10] = in_XMM1_Bk;
      auVar3[0xb] = in_XMM1_Bl;
      auVar3[0xc] = in_XMM1_Bm;
      auVar3[0xd] = in_XMM1_Bn;
      auVar3[0xe] = in_XMM1_Bo;
      auVar3[0xf] = in_XMM1_Bp;
      auVar4[1] = in_XMM1_Bb;
      auVar4[0] = in_XMM1_Ba;
      auVar4[2] = in_XMM1_Bc;
      auVar4[3] = in_XMM1_Bd;
      auVar4[4] = in_XMM1_Be;
      auVar4[5] = in_XMM1_Bf;
      auVar4[6] = in_XMM1_Bg;
      auVar4[7] = in_XMM1_Bh;
      auVar4[8] = in_XMM1_Bi;
      auVar4[9] = in_XMM1_Bj;
      auVar4[10] = in_XMM1_Bk;
      auVar4[0xb] = in_XMM1_Bl;
      auVar4[0xc] = in_XMM1_Bm;
      auVar4[0xd] = in_XMM1_Bn;
      auVar4[0xe] = in_XMM1_Bo;
      auVar4[0xf] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bd;
      auVar12[0] = in_XMM1_Bc;
      auVar12[2] = in_XMM1_Be;
      auVar12[3] = in_XMM1_Bf;
      auVar12[4] = in_XMM1_Bg;
      auVar12[5] = in_XMM1_Bh;
      auVar12[6] = in_XMM1_Bi;
      auVar12[7] = in_XMM1_Bj;
      auVar12[8] = in_XMM1_Bk;
      auVar12[9] = in_XMM1_Bl;
      auVar12[10] = in_XMM1_Bm;
      auVar12[0xb] = in_XMM1_Bn;
      auVar12[0xc] = in_XMM1_Bo;
      auVar12[0xd] = in_XMM1_Bp;
      auVar11[1] = in_XMM1_Be;
      auVar11[0] = in_XMM1_Bd;
      auVar11[2] = in_XMM1_Bf;
      auVar11[3] = in_XMM1_Bg;
      auVar11[4] = in_XMM1_Bh;
      auVar11[5] = in_XMM1_Bi;
      auVar11[6] = in_XMM1_Bj;
      auVar11[7] = in_XMM1_Bk;
      auVar11[8] = in_XMM1_Bl;
      auVar11[9] = in_XMM1_Bm;
      auVar11[10] = in_XMM1_Bn;
      auVar11[0xb] = in_XMM1_Bo;
      auVar11[0xc] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Bf;
      auVar10[0] = in_XMM1_Be;
      auVar10[2] = in_XMM1_Bg;
      auVar10[3] = in_XMM1_Bh;
      auVar10[4] = in_XMM1_Bi;
      auVar10[5] = in_XMM1_Bj;
      auVar10[6] = in_XMM1_Bk;
      auVar10[7] = in_XMM1_Bl;
      auVar10[8] = in_XMM1_Bm;
      auVar10[9] = in_XMM1_Bn;
      auVar10[10] = in_XMM1_Bo;
      auVar10[0xb] = in_XMM1_Bp;
      auVar9[1] = in_XMM1_Bg;
      auVar9[0] = in_XMM1_Bf;
      auVar9[2] = in_XMM1_Bh;
      auVar9[3] = in_XMM1_Bi;
      auVar9[4] = in_XMM1_Bj;
      auVar9[5] = in_XMM1_Bk;
      auVar9[6] = in_XMM1_Bl;
      auVar9[7] = in_XMM1_Bm;
      auVar9[8] = in_XMM1_Bn;
      auVar9[9] = in_XMM1_Bo;
      auVar9[10] = in_XMM1_Bp;
      uVar13 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      aVar15.slot_ = (slot_type *)((long)aVar15.slot_ + (ulong)(uVar2 << 5));
      cVar1 = pcVar14[uVar2];
      pcVar14 = pcVar14 + uVar2;
    }
    if (*pcVar14 < ~kSentinel) {
      __assert_fail("(IsFull(*it.control())) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb58,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::begin() [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                   );
    }
  }
  iVar16.field_1.slot_ = aVar15.slot_;
  iVar16.ctrl_ = pcVar14;
  return iVar16;
}

Assistant:

iterator begin() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    if (ABSL_PREDICT_FALSE(empty())) return end();
    if (is_soo()) return soo_iterator();
    iterator it = {control(), common().slots_union(),
                   common().generation_ptr()};
    it.skip_empty_or_deleted();
    ABSL_SWISSTABLE_ASSERT(IsFull(*it.control()));
    return it;
  }